

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O0

uintptr_t __thiscall pstack::Procman::StackFrame::getFrameBase(StackFrame *this,Process *p)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> proc;
  bool bVar1;
  DIE *this_00;
  Addr reloc;
  undefined1 local_d8 [8];
  ExpressionStack stack;
  Attribute base;
  DIE *f;
  ProcessLocation location;
  Process *p_local;
  StackFrame *this_local;
  
  location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p;
  scopeIP((ProcessLocation *)&f,this,p);
  this_00 = ProcessLocation::die((ProcessLocation *)&f);
  bVar1 = Dwarf::DIE::operator_cast_to_bool(this_00);
  if (bVar1) {
    pstack::Dwarf::DIE::attribute((int)&stack + DW_AT_data_location,SUB81(this_00,0));
    bVar1 = Dwarf::DIE::Attribute::valid((Attribute *)&stack.isValue);
    if (bVar1) {
      ExpressionStack::ExpressionStack((ExpressionStack *)local_d8);
      proc = location.codeloc.
             super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
      reloc = ProcessLocation::elfReloc((ProcessLocation *)&f);
      this_local = (StackFrame *)
                   ExpressionStack::eval
                             ((ExpressionStack *)local_d8,(Process *)proc._M_pi,
                              (Attribute *)&stack.isValue,this,reloc);
      ExpressionStack::~ExpressionStack((ExpressionStack *)local_d8);
    }
    Dwarf::DIE::Attribute::~Attribute((Attribute *)&stack.isValue);
    if (bVar1) goto LAB_001c6348;
  }
  this_local = (StackFrame *)0x0;
LAB_001c6348:
  ProcessLocation::~ProcessLocation((ProcessLocation *)&f);
  return (uintptr_t)this_local;
}

Assistant:

uintptr_t
StackFrame::getFrameBase(Process &p) const
{
    ProcessLocation location = scopeIP(p);
    const Dwarf::DIE &f = location.die();
    if (f) {
        auto base = f.attribute(Dwarf::DW_AT_frame_base);
        if (base.valid()) {
            ExpressionStack stack;
            return stack.eval(p, base, this, location.elfReloc());
        }
    }
    return 0;
}